

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O2

AnyCellmlElementPtr __thiscall
libcellml::Annotator::AnnotatorImpl::convertToWeak(AnnotatorImpl *this,AnyCellmlElementPtr *item)

{
  CellmlElementType CVar1;
  undefined8 *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  AnyCellmlElementPtr AVar3;
  ResetWeakPtr weakReset;
  shared_ptr<libcellml::UnitsItem> local_30;
  __shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  AnyCellmlElement::AnyCellmlElementImpl::create();
  CVar1 = AnyCellmlElement::type((AnyCellmlElement *)*in_RDX);
  *(CellmlElementType *)
   *(this->super_LoggerImpl).mErrors.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = CVar1;
  CVar1 = AnyCellmlElement::type((AnyCellmlElement *)*in_RDX);
  switch(CVar1) {
  case COMPONENT:
  case COMPONENT_REF:
    AnyCellmlElement::component((AnyCellmlElement *)&local_20);
    std::__weak_ptr<libcellml::Component,(__gnu_cxx::_Lock_policy)2>::
    __weak_ptr<libcellml::Component,void>
              ((__weak_ptr<libcellml::Component,(__gnu_cxx::_Lock_policy)2> *)&local_30,&local_20);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
    std::any::operator=((any *)(*(this->super_LoggerImpl).mErrors.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 8),
                        (weak_ptr<libcellml::Component> *)&local_30);
    break;
  case CONNECTION:
  case MAP_VARIABLES:
    AnyCellmlElement::variablePair((AnyCellmlElement *)&local_30);
    std::any::operator=((any *)(*(this->super_LoggerImpl).mErrors.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 8),
                        (shared_ptr<libcellml::VariablePair> *)&local_30);
    goto LAB_001bd8da;
  case ENCAPSULATION:
  case MODEL:
    AnyCellmlElement::model((AnyCellmlElement *)&local_20);
    std::__weak_ptr<libcellml::Model,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<libcellml::Model,void>
              ((__weak_ptr<libcellml::Model,(__gnu_cxx::_Lock_policy)2> *)&local_30,
               (__shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)&local_20);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
    std::any::operator=((any *)(*(this->super_LoggerImpl).mErrors.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 8),
                        (weak_ptr<libcellml::Model> *)&local_30);
    break;
  case IMPORT:
    AnyCellmlElement::importSource((AnyCellmlElement *)&local_20);
    std::__weak_ptr<libcellml::ImportSource,(__gnu_cxx::_Lock_policy)2>::
    __weak_ptr<libcellml::ImportSource,void>
              ((__weak_ptr<libcellml::ImportSource,(__gnu_cxx::_Lock_policy)2> *)&local_30,
               (__shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2> *)&local_20);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
    std::any::operator=((any *)(*(this->super_LoggerImpl).mErrors.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 8),
                        (weak_ptr<libcellml::ImportSource> *)&local_30);
    break;
  default:
    AnyCellmlElement::variable((AnyCellmlElement *)&local_20);
    std::__weak_ptr<libcellml::Variable,(__gnu_cxx::_Lock_policy)2>::
    __weak_ptr<libcellml::Variable,void>
              ((__weak_ptr<libcellml::Variable,(__gnu_cxx::_Lock_policy)2> *)&local_30,
               (__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> *)&local_20);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
    std::any::operator=((any *)(*(this->super_LoggerImpl).mErrors.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 8),
                        (weak_ptr<libcellml::Variable> *)&local_30);
    break;
  case RESET:
  case RESET_VALUE:
  case TEST_VALUE:
    AnyCellmlElement::reset((AnyCellmlElement *)&local_20);
    std::__weak_ptr<libcellml::Reset,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<libcellml::Reset,void>
              ((__weak_ptr<libcellml::Reset,(__gnu_cxx::_Lock_policy)2> *)&local_30,
               (__shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2> *)&local_20);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
    std::any::operator=((any *)(*(this->super_LoggerImpl).mErrors.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 8),
                        (weak_ptr<libcellml::Reset> *)&local_30);
    break;
  case UNIT:
    AnyCellmlElement::unitsItem((AnyCellmlElement *)&local_30);
    std::any::operator=((any *)(*(this->super_LoggerImpl).mErrors.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 8),&local_30);
LAB_001bd8da:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_30.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    _Var2._M_pi = extraout_RDX;
    goto LAB_001bd9a8;
  case UNITS:
    AnyCellmlElement::units((AnyCellmlElement *)&local_20);
    std::__weak_ptr<libcellml::Units,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<libcellml::Units,void>
              ((__weak_ptr<libcellml::Units,(__gnu_cxx::_Lock_policy)2> *)&local_30,
               (__shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2> *)&local_20);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
    std::any::operator=((any *)(*(this->super_LoggerImpl).mErrors.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 8),
                        (weak_ptr<libcellml::Units> *)&local_30);
  }
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_30.super___shared_ptr<libcellml::UnitsItem,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  _Var2._M_pi = extraout_RDX_00;
LAB_001bd9a8:
  AVar3.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  AVar3.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (AnyCellmlElementPtr)
         AVar3.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

AnyCellmlElementPtr Annotator::AnnotatorImpl::convertToWeak(const AnyCellmlElementPtr &item)
{
    auto converted = AnyCellmlElement::AnyCellmlElementImpl::create();
    auto type = item->type();

    converted->mPimpl->mType = type;

    switch (item->type()) {
    case CellmlElementType::COMPONENT:
    case CellmlElementType::COMPONENT_REF: {
        ComponentWeakPtr weakComponent = item->component();
        converted->mPimpl->mItem = weakComponent;
    } break;
    case CellmlElementType::CONNECTION:
    case CellmlElementType::MAP_VARIABLES:
        // We don't store a weak pointer for connections / map variables because
        // the map is the owner of the VariablePair object.
        converted->mPimpl->mItem = item->variablePair();
        break;
    case CellmlElementType::ENCAPSULATION:
    case CellmlElementType::MODEL: {
        ModelWeakPtr weakModel = item->model();
        converted->mPimpl->mItem = weakModel;
    } break;
    case CellmlElementType::IMPORT: {
        ImportSourceWeakPtr weakImportSource = item->importSource();
        converted->mPimpl->mItem = weakImportSource;
    } break;
    case CellmlElementType::RESET:
    case CellmlElementType::RESET_VALUE:
    case CellmlElementType::TEST_VALUE: {
        ResetWeakPtr weakReset = item->reset();
        converted->mPimpl->mItem = weakReset;
    } break;
    case CellmlElementType::UNIT:
        // We don't store a weak pointer for units item because the map is the
        // owner of the UnitsItem object.
        converted->mPimpl->mItem = item->unitsItem();
        break;
    case CellmlElementType::UNITS: {
        UnitsWeakPtr weakUnits = item->units();
        converted->mPimpl->mItem = weakUnits;
    } break;
    default: { /* CellmlElementType::VARIABLE */
        VariableWeakPtr weakVariable = item->variable();
        converted->mPimpl->mItem = weakVariable;
    } break;
    }

    return converted;
}